

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QString>::moveAppend
          (QGenericArrayOps<QString> *this,QString *b,QString *e)

{
  QString *pQVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  
  if ((b != e) && (b < e)) {
    pQVar1 = (this->super_QArrayDataPointer<QString>).ptr;
    qVar5 = (this->super_QArrayDataPointer<QString>).size;
    do {
      pDVar2 = (b->d).d;
      (b->d).d = (Data *)0x0;
      pQVar1[qVar5].d.d = pDVar2;
      pcVar3 = (b->d).ptr;
      (b->d).ptr = (char16_t *)0x0;
      pQVar1[qVar5].d.ptr = pcVar3;
      qVar4 = (b->d).size;
      (b->d).size = 0;
      pQVar1[qVar5].d.size = qVar4;
      b = b + 1;
      qVar5 = (this->super_QArrayDataPointer<QString>).size + 1;
      (this->super_QArrayDataPointer<QString>).size = qVar5;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }